

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::getBlockTemplate(SelfSelectClient *this)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar1;
  SelfSelectClient *in_RDI;
  int __flags;
  Value params;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document doc;
  undefined8 in_stack_ffffffffffffff08;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff10;
  SelfSelectClient *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff60;
  StringRefType *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff88;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *method;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  
  setState(in_stack_ffffffffffffff20,(State)((ulong)in_RDI >> 0x20));
  __flags = 0;
  pGVar1 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)&stack0xffffffffffffff98;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40
                    ,in_stack_ffffffffffffff38,(CrtAllocator *)in_stack_ffffffffffffff30);
  this_00 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GetAllocator(pGVar1);
  method = this_00;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_ffffffffffffff10,(Type)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  rapidjson::GenericStringRef<char>::GenericStringRef<15u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff60,(char (*) [15])"wallet_address");
  pGVar1 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)Job::poolWallet(&in_RDI->m_job);
  String::toJSON((String *)this_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff50);
  rapidjson::GenericStringRef<char>::GenericStringRef<12u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff40,(char (*) [12])"extra_nonce");
  Job::extraNonce(&in_RDI->m_job);
  String::toJSON((String *)this_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff30);
  in_RDI->m_sequence = in_RDI->m_sequence + 1;
  JsonRequest::create((Document *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)method
                      ,in_stack_ffffffffffffff88);
  send(in_RDI,3,"/json_rpc",(size_t)&stack0xffffffffffffff98,__flags);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff70);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(pGVar1);
  return;
}

Assistant:

void xmrig::SelfSelectClient::getBlockTemplate()
{
    setState(WaitState);

    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember("wallet_address",  m_job.poolWallet().toJSON(), allocator);
    params.AddMember("extra_nonce",     m_job.extraNonce().toJSON(), allocator);

    JsonRequest::create(doc, m_sequence++, "getblocktemplate", params);

    send(HTTP_POST, "/json_rpc", doc);
}